

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O1

void __thiscall ProblemAloha::SetYScopes(ProblemAloha *this)

{
  bool bVar1;
  ulong uVar2;
  Index y;
  Index x_00;
  uint uVar3;
  Scope a;
  Scope x;
  Scope local_a8;
  Scope local_88;
  string local_70;
  TwoStageDynamicBayesianNetwork *local_50;
  Scope local_48;
  
  if (this->_m_nrIslands != 0) {
    local_50 = &(this->super_FactoredDecPOMDPDiscrete).
                super_MultiAgentDecisionProcessDiscreteFactoredStates._m_2dbn;
    uVar2 = 0;
    do {
      local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      x_00 = (Index)uVar2;
      local_70._M_dataplus._M_p._0_4_ = x_00;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,(iterator)0x0,
                 (uint *)&local_70);
      local_70._M_dataplus._M_p._0_4_ = x_00;
      if (local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,
                   (iterator)
                   local_a8.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_70);
      }
      else {
        *local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = x_00;
        local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (this->_m_nrIslands != 0) {
        uVar3 = 1;
        do {
          y = uVar3 - 1;
          bVar1 = areNeighbors(this,x_00,y);
          if (bVar1) {
            if (local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_70._M_dataplus._M_p._0_4_ = y;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,
                         (iterator)
                         local_88.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(uint *)&local_70);
            }
            else {
              *local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = y;
              local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_88.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_70._M_dataplus._M_p._0_4_ = y;
            if (local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,
                         (iterator)
                         local_a8.super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(uint *)&local_70);
            }
            else {
              *local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish = y;
              local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_a8.super_SDT.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar2 = (ulong)uVar3;
          uVar3 = uVar3 + 1;
        } while (uVar2 < this->_m_nrIslands);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<>","");
      Scope::Scope(&local_48,&local_70);
      TwoStageDynamicBayesianNetwork::SetSoI_Y(local_50,x_00,&local_88,&local_a8,&local_48);
      if (local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (local_a8.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar2 = (ulong)(x_00 + 1);
    } while (uVar2 < this->_m_nrIslands);
  }
  return;
}

Assistant:

void ProblemAloha::SetYScopes()
{    
//specify connections for the 2DBN

    for(Index yI=0; yI < _m_nrIslands; yI++)
    {
        //determine the X scope of influence (i.e., state factors at prev.stage)
        Scope x;
        Scope a;
        // depends on your own state and action
        x.Insert(yI);
        a.Insert(yI);
        for(Index yI1=0; yI1 < _m_nrIslands; yI1++)
            if(areNeighbors(yI,yI1)) // and on your neighbors
            {
                x.Insert(yI1);
                a.Insert(yI1);
            }

        SetSoI_Y( yI,
                  x,
                  a,
                  Scope("<>") // no interdependencies in next stage
            );
    }
}